

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::undoLast(Plan *this)

{
  _List_node_base *p_Var1;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  
  if (this->last_changed != (Station *)0x0) {
    Station::undoLast_abi_cxx11_(&local_30,this->last_changed);
    if (local_30.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      incremental_eval(this,this->last_changed,&local_30);
    }
    while (local_30.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_30) {
      p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &(local_30.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_30.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
      local_30.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = p_Var1;
    }
  }
  return;
}

Assistant:

void Plan::undoLast() {
    if (last_changed==NULL) return;
    list< pair< int, double > > diff = last_changed->undoLast();
    if (diff.size()>0)
      incremental_eval (*last_changed, diff);
  }